

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cc
# Opt level: O2

Reactor_base * __thiscall
iqxmlrpc::Serial_executor_factory::create_reactor(Serial_executor_factory *this)

{
  Reactor<iqnet::Null_lock> *this_00;
  
  this_00 = (Reactor<iqnet::Null_lock> *)operator_new(0x70);
  iqnet::Reactor<iqnet::Null_lock>::Reactor(this_00);
  return &this_00->super_Reactor_base;
}

Assistant:

iqnet::Reactor_base* Serial_executor_factory::create_reactor()
{
  return new iqnet::Reactor<iqnet::Null_lock>;
}